

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * JSON::stringEscape(string *__return_storage_ptr__,string *str,char ch)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar5 = (uint)str->_M_string_length;
  if (0 < (int)uVar5) {
    uVar7 = (ulong)(uVar5 & 0x7fffffff);
    do {
      uVar6 = uVar7 - 1;
      if ((str->_M_dataplus)._M_p[uVar6] == ch) {
        std::__cxx11::string::replace((ulong)str,uVar6,(char *)0x0,0x10a2f3);
      }
      bVar3 = 1 < (long)uVar7;
      uVar7 = uVar6;
    } while (bVar3);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (str->_M_dataplus)._M_p;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar4 = *(undefined8 *)((long)&str->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = str->_M_string_length;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string stringEscape(string str, char ch) {
        int length = str.size();
        int i = length - 1;
        while (i >= 0) {
            if (str[i] == ch) {
                str.replace(i, 0, "\\");
            }
            i--;
        }
        return str;
    }